

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

DecodeStatus DecodeCrosspathX1(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  MCOperand *op;
  DecodeStatus ret;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  DecodeStatus local_4;
  
  ret = MCDisassembler_Success;
  if (Inst->flat_insn->detail == (cs_detail *)0x0) {
    local_4 = MCDisassembler_Success;
  }
  else {
    if (Val == 0) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.mem.base = X86_REG_INVALID;
    }
    else if (Val == 1) {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.mem.base = X86_REG_AH;
      if (Inst->Operands[0].Kind == '\x01') {
        if ((Inst->Operands[0].field_2.RegVal < 0x19) || (0x38 < Inst->Operands[0].field_2.RegVal))
        {
          if ((0x38 < Inst->Operands[0].field_2.RegVal) && (Inst->Operands[0].field_2.RegVal < 0x59)
             ) {
            Inst->Operands[0].field_2.RegVal = Inst->Operands[0].field_2.RegVal - 0x20;
          }
        }
        else {
          Inst->Operands[0].field_2.RegVal = Inst->Operands[0].field_2.RegVal + 0x20;
        }
      }
    }
    else {
      (Inst->flat_insn->detail->field_6).x86.operands[4].field_1.mem.base = ~X86_REG_INVALID;
      ret = MCDisassembler_Fail;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeCrosspathX1(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;
	MCOperand *op;

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = 0;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = 1;
			op = &Inst->Operands[0];
			if(op->Kind == kRegister) {
				if((op->RegVal >= TMS320C64X_REG_A0) && (op->RegVal <= TMS320C64X_REG_A31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
				else if((op->RegVal >= TMS320C64X_REG_B0) && (op->RegVal <= TMS320C64X_REG_B31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			}
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.funit.crosspath = -1;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}